

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_40;
  char *pattern_end;
  char *next_sep;
  char *pattern;
  char *filter_local;
  string *name_str_local;
  
  next_sep = filter;
  while( true ) {
    pcVar2 = strchr(next_sep,0x3a);
    local_40 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(next_sep);
      local_40 = next_sep + sVar3;
    }
    bVar1 = PatternMatchesString(name_str,next_sep,local_40);
    if (bVar1) break;
    if (pcVar2 == (char *)0x0) {
      return false;
    }
    next_sep = pcVar2 + 1;
  }
  return true;
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  // The filter is a list of patterns separated by colons (:).
  const char* pattern = filter;
  while (true) {
    // Find the bounds of this pattern.
    const char* const next_sep = strchr(pattern, ':');
    const char* const pattern_end =
        next_sep != nullptr ? next_sep : pattern + strlen(pattern);

    // Check if this pattern matches name_str.
    if (PatternMatchesString(name_str, pattern, pattern_end)) {
      return true;
    }

    // Give up on this pattern. However, if we found a pattern separator (:),
    // advance to the next pattern (skipping over the separator) and restart.
    if (next_sep == nullptr) {
      return false;
    }
    pattern = next_sep + 1;
  }
  return true;
}